

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void init_beaudet(beaudet_t *Ix,beaudet_t *Ixx,beaudet_t *Ixy)

{
  *(float *)((long)(Ix->g + 0) + 0) = -2.0;
  *(float *)((long)(Ix->g + 0) + 4) = -2.0;
  *(float *)((long)(Ix->g + 0) + 8) = -2.0;
  *(float *)((long)(Ix->g + 0) + 0xc) = -2.0;
  *(float *)((long)(Ix->g + 4) + 0) = 2.0;
  *(float *)((long)(Ix->g + 4) + 4) = 2.0;
  *(float *)((long)(Ix->g + 4) + 8) = 2.0;
  *(float *)((long)(Ix->g + 4) + 0xc) = 2.0;
  *(undefined8 *)(Ix->g[0] + 4) = 0xbf800000c0000000;
  *(float *)((long)(Ix->g + 1) + 4) = -1.0;
  *(float *)((long)(Ix->g + 1) + 8) = -1.0;
  *(float *)((long)(Ix->g + 1) + 0xc) = -1.0;
  *(float *)((long)(Ix->g + 1) + 0x10) = -1.0;
  *(float *)((long)(Ix->g + 2) + 0) = 0.0;
  *(float *)((long)(Ix->g + 2) + 4) = 0.0;
  *(float *)((long)(Ix->g + 2) + 8) = 0.0;
  *(float *)((long)(Ix->g + 2) + 0xc) = 0.0;
  *(undefined8 *)(Ix->g[2] + 4) = 0x3f80000000000000;
  *(float *)((long)(Ix->g + 3) + 4) = 1.0;
  *(float *)((long)(Ix->g + 3) + 8) = 1.0;
  *(float *)((long)(Ix->g + 3) + 0xc) = 1.0;
  *(float *)((long)(Ix->g + 3) + 0x10) = 1.0;
  *(undefined8 *)(Ix->g[4] + 4) = 0x4248000040000000;
  Ix->m = 5;
  *(float *)((long)(Ixx->g + 0) + 0) = 2.0;
  *(float *)((long)(Ixx->g + 0) + 4) = 2.0;
  *(float *)((long)(Ixx->g + 0) + 8) = 2.0;
  *(float *)((long)(Ixx->g + 0) + 0xc) = 2.0;
  *(float *)((long)(Ixx->g + 4) + 0) = 2.0;
  *(float *)((long)(Ixx->g + 4) + 4) = 2.0;
  *(float *)((long)(Ixx->g + 4) + 8) = 2.0;
  *(float *)((long)(Ixx->g + 4) + 0xc) = 2.0;
  *(undefined8 *)(Ixx->g[0] + 4) = 0xbf80000040000000;
  *(float *)((long)(Ixx->g + 1) + 4) = -1.0;
  *(float *)((long)(Ixx->g + 1) + 8) = -1.0;
  *(float *)((long)(Ixx->g + 1) + 0xc) = -1.0;
  *(float *)((long)(Ixx->g + 1) + 0x10) = -1.0;
  *(float *)((long)(Ixx->g + 2) + 0) = -2.0;
  *(float *)((long)(Ixx->g + 2) + 4) = -2.0;
  *(float *)((long)(Ixx->g + 2) + 8) = -2.0;
  *(float *)((long)(Ixx->g + 2) + 0xc) = -2.0;
  *(undefined8 *)(Ixx->g[2] + 4) = 0xbf800000c0000000;
  *(float *)((long)(Ixx->g + 3) + 4) = -1.0;
  *(float *)((long)(Ixx->g + 3) + 8) = -1.0;
  *(float *)((long)(Ixx->g + 3) + 0xc) = -1.0;
  *(float *)((long)(Ixx->g + 3) + 0x10) = -1.0;
  *(undefined8 *)(Ixx->g[4] + 4) = 0x420c000040000000;
  Ixx->m = 5;
  *(float *)((long)(Ixy->g + 0) + 0) = 4.0;
  *(float *)((long)(Ixy->g + 0) + 4) = 2.0;
  *(float *)((long)(Ixy->g + 0) + 8) = 0.0;
  *(float *)((long)(Ixy->g + 0) + 0xc) = -2.0;
  *(float *)((long)(Ixy->g + 4) + 0) = -4.0;
  *(float *)((long)(Ixy->g + 4) + 4) = -2.0;
  *(float *)((long)(Ixy->g + 4) + 8) = 0.0;
  *(float *)((long)(Ixy->g + 4) + 0xc) = 2.0;
  *(undefined8 *)(Ixy->g[0] + 4) = 0x40000000c0800000;
  *(float *)((long)(Ixy->g + 1) + 4) = 1.0;
  *(float *)((long)(Ixy->g + 1) + 8) = 0.0;
  *(float *)((long)(Ixy->g + 1) + 0xc) = -1.0;
  *(float *)((long)(Ixy->g + 1) + 0x10) = -2.0;
  *(float *)((long)(Ixy->g + 2) + 0) = 0.0;
  *(float *)((long)(Ixy->g + 2) + 4) = 0.0;
  *(float *)((long)(Ixy->g + 2) + 8) = 0.0;
  *(float *)((long)(Ixy->g + 2) + 0xc) = 0.0;
  *(undefined8 *)(Ixy->g[2] + 4) = 0xc000000000000000;
  *(float *)((long)(Ixy->g + 3) + 4) = -1.0;
  *(float *)((long)(Ixy->g + 3) + 8) = 0.0;
  *(float *)((long)(Ixy->g + 3) + 0xc) = 1.0;
  *(float *)((long)(Ixy->g + 3) + 0x10) = 2.0;
  *(undefined8 *)(Ixy->g[4] + 4) = 0x42c8000040800000;
  Ixy->m = 5;
  return;
}

Assistant:

void init_beaudet(Ix,Ixx,Ixy)
beaudet_t *Ix, *Ixx, *Ixy ;

{
  (*Ix).g[0][0] = -2 ; (*Ix).g[1][0] = -1 ; (*Ix).g[2][0] = 0 ;
  (*Ix).g[3][0] = 1 ;  (*Ix).g[4][0] = 2 ;
  (*Ix).g[0][1] = -2 ; (*Ix).g[1][1] = -1 ; (*Ix).g[2][1] = 0 ;
  (*Ix).g[3][1] = 1 ;  (*Ix).g[4][1] = 2 ;
  (*Ix).g[0][2] = -2 ; (*Ix).g[1][2] = -1 ; (*Ix).g[2][2] = 0 ;
  (*Ix).g[3][2] = 1 ;  (*Ix).g[4][2] = 2 ;
  (*Ix).g[0][3] = -2 ; (*Ix).g[1][3] = -1 ; (*Ix).g[2][3] = 0 ;
  (*Ix).g[3][3] = 1 ;  (*Ix).g[4][3] = 2 ;
  (*Ix).g[0][4] = -2 ; (*Ix).g[1][4] = -1 ; (*Ix).g[2][4] = 0 ;
  (*Ix).g[3][4] = 1 ;  (*Ix).g[4][4] = 2 ;
  (*Ix).f = 50.0 ;
  (*Ix).m = 5 ;

  (*Ixx).g[0][0] = 2 ;  (*Ixx).g[1][0] = -1 ;  (*Ixx).g[2][0] = -2 ;
  (*Ixx).g[3][0] = -1 ;  (*Ixx).g[4][0] = 2 ;
  (*Ixx).g[0][1] = 2 ; (*Ixx).g[1][1] = -1 ; (*Ixx).g[2][1] = -2;
  (*Ixx).g[3][1] = -1 ; (*Ixx).g[4][1] = 2 ;
  (*Ixx).g[0][2] = 2 ; (*Ixx).g[1][2] = -1 ; (*Ixx).g[2][2] = -2 ;
  (*Ixx).g[3][2] = -1 ; (*Ixx).g[4][2] = 2 ;
  (*Ixx).g[0][3] = 2 ; (*Ixx).g[1][3] = -1 ; (*Ixx).g[2][3] = -2 ;
  (*Ixx).g[3][3] = -1 ; (*Ixx).g[4][3] = 2 ;
  (*Ixx).g[0][4] = 2 ;  (*Ixx).g[1][4] = -1 ;  (*Ixx).g[2][4] = -2 ;
  (*Ixx).g[3][4] = -1 ;  (*Ixx).g[4][4] = 2 ;
  (*Ixx).f = 35.0 ;
  (*Ixx).m = 5 ;

  (*Ixy).g[0][0] = 4 ;  (*Ixy).g[1][0] = 2 ;  (*Ixy).g[2][0] = 0 ;
  (*Ixy).g[3][0] = -2 ; (*Ixy).g[4][0] = -4 ;
  (*Ixy).g[0][1] = 2 ;  (*Ixy).g[1][1] = 1 ;  (*Ixy).g[2][1] = 0 ;
  (*Ixy).g[3][1] = -1 ; (*Ixy).g[4][1] = -2 ;
  (*Ixy).g[0][2] = 0 ;  (*Ixy).g[1][2] = 0 ;  (*Ixy).g[2][2] = 0 ;
  (*Ixy).g[3][2] = 0 ;  (*Ixy).g[4][2] = 0 ;
  (*Ixy).g[0][3] = -2 ; (*Ixy).g[1][3] = -1 ; (*Ixy).g[2][3] = 0 ;
  (*Ixy).g[3][3] = 1 ;  (*Ixy).g[4][3] = 2 ;
  (*Ixy).g[0][4] = -4 ; (*Ixy).g[1][4] = -2 ; (*Ixy).g[2][4] = 0 ;
  (*Ixy).g[3][4] = 2 ;  (*Ixy).g[4][4] = 4 ;
  (*Ixy).f = 100.0 ;
  (*Ixy).m = 5 ;
}